

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O3

int Rsb_ManPerformResub6
              (Rsb_Man_t *p,int nVarsAll,word uTruth,Vec_Wrd_t *vDivTruths,word *puTruth0,
              word *puTruth1,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  word *pwVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  word *pGs [200];
  word local_680;
  word *local_678;
  long alStack_670 [200];
  long lVar16;
  
  iVar3 = vDivTruths->nSize;
  local_680 = uTruth;
  if (199 < (long)iVar3) {
    __assert_fail("nGs < 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbDec6.c"
                  ,699,
                  "int Rsb_ManPerformResub6(Rsb_Man_t *, int, word, Vec_Wrd_t *, word *, word *, int)"
                 );
  }
  if (0 < iVar3) {
    pwVar4 = vDivTruths->pArray;
    lVar16 = (long)iVar3 + -1;
    auVar14._8_4_ = (int)lVar16;
    auVar14._0_8_ = lVar16;
    auVar14._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar7 = 0;
    auVar14 = auVar14 ^ _DAT_0094e250;
    auVar15 = _DAT_0094e240;
    do {
      auVar17 = auVar15 ^ _DAT_0094e250;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        alStack_670[uVar7 - 1] = (long)pwVar4;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        alStack_670[uVar7] = (long)(pwVar4 + 1);
      }
      uVar7 = uVar7 + 2;
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
      pwVar4 = pwVar4 + 2;
    } while ((iVar3 + 1U & 0xfffffffe) != uVar7);
  }
  uVar2 = Rsb_DecPerformInt(p,nVarsAll,&local_680,&local_678,iVar3,iVar3,0);
  if (uVar2 == 0) {
    iVar3 = 0;
  }
  else {
    if (fVerbose != 0) {
      Rsb_DecPrintFunc(p,uVar2,&local_680,&local_678,iVar3,nVarsAll);
      Rsb_DecPrintTable(p->vCexes->pArray,iVar3,iVar3,p->vTries);
    }
    uVar1 = p->vFanins->nSize;
    if ((int)uVar1 < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    uVar5 = 2;
    if (2 < uVar1) {
      uVar5 = uVar1;
    }
    uVar9 = 3;
    if (2 < uVar1) {
      uVar9 = uVar5;
    }
    uVar5 = 4;
    if (uVar9 != 3) {
      uVar5 = uVar9;
    }
    uVar8 = 5;
    if (uVar5 != 4) {
      uVar8 = uVar5;
    }
    if (1 < uVar8 - 5) {
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar6 = 1 << ((byte)uVar1 & 0x1f);
    uVar10 = uVar2 >> ((byte)uVar6 & 0x1f);
    uVar6 = -(uint)((uVar2 >> (uVar6 & 0x1f) & 1) != 0);
    uVar13 = -(uVar2 & 1);
    if (uVar1 != 0) {
      uVar6 = uVar10;
      uVar13 = uVar2;
    }
    uVar13 = (uVar13 & 3) * 5;
    if (1 < uVar1) {
      uVar13 = uVar2;
    }
    uVar6 = (uVar6 & 3) * 5;
    if (1 < uVar1) {
      uVar6 = uVar10;
    }
    uVar13 = (uVar13 & 0xf) << 4 | uVar13 & 0xf;
    if (2 < uVar1) {
      uVar13 = uVar2;
    }
    uVar2 = (uVar6 & 0xf) << 4 | uVar6 & 0xf;
    if (2 < uVar1) {
      uVar2 = uVar10;
    }
    uVar7 = (ulong)uVar13 & 0xff;
    uVar11 = (ulong)uVar2 & 0xff;
    uVar11 = (uint)((int)uVar11 << 8) | uVar11;
    uVar7 = (uint)((int)uVar7 << 8) | uVar7;
    if (uVar9 != 3) {
      uVar11 = (ulong)uVar2;
      uVar7 = (ulong)uVar13;
    }
    uVar12 = (ulong)(uint)((int)uVar7 << 0x10) | uVar7 & 0xffff;
    if (uVar5 != 4) {
      uVar12 = uVar7;
    }
    iVar3 = 1;
    uVar7 = (ulong)(uint)((int)uVar11 << 0x10) | uVar11 & 0xffff;
    if (uVar5 != 4) {
      uVar7 = uVar11;
    }
    uVar11 = uVar12 << 0x20 | uVar12;
    if (uVar8 != 5) {
      uVar11 = uVar12;
    }
    *puTruth0 = uVar11;
    uVar11 = uVar7 << 0x20 | uVar7;
    if (uVar8 != 5) {
      uVar11 = uVar7;
    }
    *puTruth1 = uVar11;
  }
  return iVar3;
}

Assistant:

int Rsb_ManPerformResub6( Rsb_Man_t * p, int nVarsAll, word uTruth, Vec_Wrd_t * vDivTruths, word * puTruth0, word * puTruth1, int fVerbose )
{
    word * pGs[200];
    unsigned uTruthRes;
    int i, nVars, nGs = Vec_WrdSize(vDivTruths);
    assert( nGs < 200 );
    for ( i = 0; i < nGs; i++ )
        pGs[i] = Vec_WrdEntryP(vDivTruths,i);
    uTruthRes = Rsb_DecPerformInt( p, nVarsAll, &uTruth, pGs, nGs, nGs, 0 );
    if ( uTruthRes == 0 )
        return 0;

    if ( fVerbose )
        Rsb_DecPrintFunc( p, uTruthRes, &uTruth, pGs, nGs, nVarsAll );
    if ( fVerbose )
        Rsb_DecPrintTable( Vec_WrdArray(p->vCexes), nGs, nGs, p->vTries );

    nVars = Vec_IntSize(p->vFanins);
    *puTruth0 = Abc_Tt6Stretch( uTruthRes,                 nVars );
    *puTruth1 = Abc_Tt6Stretch( uTruthRes >> (1 << nVars), nVars );
    return 1;
}